

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimax.hpp
# Opt level: O2

IMove __thiscall
generic_bots::MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_>::MakeMove
          (MinimaxBot<uttt::IBoard,_minimax::ABeta<uttt::IBoard,_uttt::Eval1>_> *this)

{
  pointer ppVar1;
  long move;
  ABeta<uttt::IBoard,_uttt::Eval1> local_31;
  _Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> local_30;
  
  minimax::ABeta<uttt::IBoard,_uttt::Eval1>::operator()
            ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)&local_30
             ,&local_31,(this->super_IBot<uttt::IBoard>).game,this->depth);
  ppVar1 = (pointer)(local_30._M_impl.super__Vector_impl_data._M_start)->first;
  std::_Vector_base<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::
  ~_Vector_base(&local_30);
  local_30._M_impl.super__Vector_impl_data._M_start = ppVar1;
  uttt::IBoard::ApplyMove((this->super_IBot<uttt::IBoard>).game,(IMove *)&local_30);
  return (IMove)local_30._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

game::IMove MakeMove()
    {
        auto move = Minimax()(*this->game, depth)[0].first;
        this->game->ApplyMove(move);
        return move;
    }